

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O3

int gmfsetkwdf77_(int64_t *MshIdx,int *KwdIdx,int *NmbLin,int *NmbTyp,int *TypTab,int *deg,
                 int *NmbNod)

{
  char *pcVar1;
  int iVar2;
  
  iVar2 = *KwdIdx;
  pcVar1 = GmfKwdFmt[iVar2][2];
  if (*pcVar1 == 's') {
    if ((pcVar1[1] == 'r') && (pcVar1[2] == '\0')) {
      iVar2 = GmfSetKwd(*MshIdx,iVar2,(long)*NmbLin,(ulong)(uint)*NmbTyp);
      return iVar2;
    }
  }
  else if (((*pcVar1 == 'h') && (pcVar1[1] == 'r')) && (pcVar1[2] == '\0')) {
    iVar2 = GmfSetKwd(*MshIdx,iVar2,(long)*NmbLin,(ulong)(uint)*NmbTyp,TypTab,(ulong)(uint)*deg,
                      CONCAT44((int)((ulong)pcVar1 >> 0x20),*NmbNod));
    return iVar2;
  }
  iVar2 = GmfSetKwd(*MshIdx,iVar2,(long)*NmbLin);
  return iVar2;
}

Assistant:

int APIF77(gmfsetkwdf77)(  int64_t *MshIdx, int *KwdIdx, int *NmbLin,
                           int *NmbTyp, int *TypTab, int *deg, int *NmbNod )
{
   if(!strcmp(GmfKwdFmt[ *KwdIdx ][2], "hr"))
      return(GmfSetKwd(*MshIdx, *KwdIdx, *NmbLin, *NmbTyp, TypTab, *deg, *NmbNod));
   else if(!strcmp(GmfKwdFmt[ *KwdIdx ][2], "sr"))
      return(GmfSetKwd(*MshIdx, *KwdIdx, *NmbLin, *NmbTyp, TypTab));
   else
      return(GmfSetKwd(*MshIdx, *KwdIdx, *NmbLin));
}